

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O0

int X509_NAME_get_text_by_OBJ(X509_NAME *name,ASN1_OBJECT *obj,char *buf,int len)

{
  int iVar1;
  X509_NAME_ENTRY *ne;
  undefined1 local_58 [8];
  CBS cbs;
  int text_len;
  int ret;
  uchar *text;
  ASN1_STRING *data;
  int i;
  int len_local;
  char *buf_local;
  ASN1_OBJECT *obj_local;
  X509_NAME *name_local;
  
  data._4_4_ = len;
  _i = (uint8_t *)buf;
  buf_local = (char *)obj;
  obj_local = (ASN1_OBJECT *)name;
  data._0_4_ = X509_NAME_get_index_by_OBJ(name,obj,-1);
  if ((int)data < 0) {
    return -1;
  }
  ne = X509_NAME_get_entry((X509_NAME *)obj_local,(int)data);
  text = (uchar *)X509_NAME_ENTRY_get_data(ne);
  _text_len = (uint8_t *)0x0;
  cbs.len._4_4_ = -1;
  cbs.len._0_4_ = ASN1_STRING_to_UTF8((uchar **)&text_len,(ASN1_STRING *)text);
  if (-1 < (int)cbs.len) {
    CBS_init((CBS *)local_58,_text_len,(long)(int)cbs.len);
    iVar1 = CBS_contains_zero_byte((CBS *)local_58);
    if (iVar1 == 0) {
      if (_i != (uint8_t *)0x0) {
        if (((data._4_4_ <= (int)cbs.len) || (data._4_4_ < 1)) ||
           (iVar1 = CBS_copy_bytes((CBS *)local_58,_i,(long)(int)cbs.len), iVar1 == 0))
        goto LAB_0023987d;
        _i[(int)cbs.len] = '\0';
      }
      cbs.len._4_4_ = (int)cbs.len;
    }
  }
LAB_0023987d:
  OPENSSL_free(_text_len);
  return cbs.len._4_4_;
}

Assistant:

int X509_NAME_get_text_by_OBJ(const X509_NAME *name, const ASN1_OBJECT *obj,
                              char *buf, int len) {
  int i = X509_NAME_get_index_by_OBJ(name, obj, -1);
  if (i < 0) {
    return -1;
  }
  const ASN1_STRING *data =
      X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));
  unsigned char *text = NULL;
  int ret = -1;
  int text_len = ASN1_STRING_to_UTF8(&text, data);
  // Fail if we could not encode as UTF-8.
  if (text_len < 0) {
    goto out;
  }
  CBS cbs;
  CBS_init(&cbs, text, text_len);
  // Fail if the UTF-8 encoding constains a 0 byte because this is
  // returned as a C string and callers very often do not check.
  if (CBS_contains_zero_byte(&cbs)) {
    goto out;
  }
  // We still support the "pass NULL to find out how much" API
  if (buf != NULL) {
    if (text_len >= len || len <= 0 ||
        !CBS_copy_bytes(&cbs, (uint8_t *)buf, text_len)) {
      goto out;
    }
    // It must be a C string
    buf[text_len] = '\0';
  }
  ret = text_len;

out:
  OPENSSL_free(text);
  return ret;
}